

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall google::protobuf::internal::DynamicMapField::~DynamicMapField(DynamicMapField *this)

{
  bool bVar1;
  Arena **v1;
  void **v2;
  LogMessage *pLVar2;
  anon_union_32_1_898eb381_for_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>_3
  *this_00;
  reference pvVar3;
  undefined1 auVar4 [16];
  value_type *kv;
  iterator __end2;
  iterator __begin2;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *__range2;
  LogMessageFatal local_40 [23];
  Voidify local_29;
  void *local_28;
  Arena *local_20;
  string *local_18;
  string *absl_log_internal_check_op_result;
  DynamicMapField *this_local;
  
  absl_log_internal_check_op_result = (string *)this;
  local_20 = MapFieldBase::arena((MapFieldBase *)this);
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>(&local_20);
  local_28 = (void *)0x0;
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_18 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::Arena*,decltype(nullptr)>(v1,v2,"arena() == nullptr");
  if (local_18 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_18);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.cc"
               ,0x1af,auVar4._0_8_,auVar4._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  this_00 = &(this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .field_0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((iterator *)&__end2.super_UntypedMapIterator.bucket_index_,&this_00->map_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end((iterator *)&kv,&this_00->map_);
  while( true ) {
    bVar1 = protobuf::operator!=
                      ((iterator *)&__end2.super_UntypedMapIterator.bucket_index_,(iterator *)&kv);
    if (!bVar1) break;
    pvVar3 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator*
                       ((iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
    MapValueRef::DeleteData(&pvVar3->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
              ((iterator *)&__end2.super_UntypedMapIterator.bucket_index_);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear
            (&(this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).field_0.map_);
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
  ~TypeDefinedMapFieldBase
            (&this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
            );
  return;
}

Assistant:

DynamicMapField::~DynamicMapField() {
  ABSL_DCHECK_EQ(arena(), nullptr);
  // DynamicMapField owns map values. Need to delete them before clearing the
  // map.
  for (auto& kv : map_) {
    kv.second.DeleteData();
  }
  map_.clear();
}